

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

bool __thiscall cmCTestSVN::NoteNewRevision(cmCTestSVN *this)

{
  cmCTest *this_00;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  ostringstream cmCTestLog_msg;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  long local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  string local_218;
  cmCTestSVN *local_1f8;
  _List_node_base *local_1f0;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  bVar1 = LoadRepositories(this);
  if (bVar1) {
    local_1f0 = (_List_node_base *)&this->Repositories;
    p_Var4 = (this->Repositories).
             super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var4 != local_1f0) {
      local_1f8 = this;
      do {
        LoadInfo_abi_cxx11_(local_1a8,this,(SVNInfo *)(p_Var4 + 1));
        std::__cxx11::string::operator=((string *)(p_Var4 + 0xb),(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                   local_1a8[0].field_2._M_local_buf[0]) + 1);
        }
        poVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Revision for repository \'",0x19)
        ;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[1]._M_next,(long)p_Var4[1]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' after update: ",0x10);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[0xb]._M_next,(long)p_Var4[0xb]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"   New revision of external repository \'",0x28);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)p_Var4[1]._M_next,(long)p_Var4[1]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' is: ",6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[0xb]._M_next,(long)p_Var4[0xb]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSVN.cxx"
                     ,0x89,(char *)local_238._M_len,false);
        if ((long *)local_238._M_len != &local_228) {
          operator_delete((void *)local_238._M_len,local_228 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        poVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Repository \'",0xc);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[1]._M_next,(long)p_Var4[1]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' URL = ",8);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[3]._M_next,(long)p_Var4[3]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        poVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Repository \'",0xc);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[1]._M_next,(long)p_Var4[1]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' Root = ",9);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[5]._M_next,(long)p_Var4[5]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if (p_Var4[5]._M_prev != (_List_node_base *)0x0) {
          bVar2 = cmCTestSVNPathStarts((string *)(p_Var4 + 3),(string *)(p_Var4 + 5));
          if (bVar2) {
            std::__cxx11::string::substr((ulong)&local_1e8,(ulong)(p_Var4 + 3));
            cmCTest::DecodeURL(&local_218,&local_1e8);
            local_1a8[0]._M_dataplus._M_p = &DAT_00000001;
            local_220 = &local_1a8[0].field_2;
            local_1a8[0].field_2._M_local_buf[0] = '/';
            local_238._M_len = local_218._M_string_length;
            local_238._M_str = local_218._M_dataplus._M_p;
            local_228 = 1;
            views._M_len = 2;
            views._M_array = &local_238;
            local_1a8[0]._M_string_length = (size_type)local_220;
            cmCatViews_abi_cxx11_(&local_1c8,views);
            std::__cxx11::string::operator=((string *)(p_Var4 + 7),(string *)&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            this = local_1f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        poVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Repository \'",0xc);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[1]._M_next,(long)p_Var4[1]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' Base = ",9);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[7]._M_next,(long)p_Var4[7]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        p_Var4 = p_Var4->_M_next;
      } while (p_Var4 != local_1f0);
    }
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).NewRevision);
  }
  return bVar1;
}

Assistant:

bool cmCTestSVN::NoteNewRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  for (SVNInfo& svninfo : this->Repositories) {
    svninfo.NewRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' after update: " << svninfo.NewRevision << "\n";
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   New revision of external repository '"
                 << svninfo.LocalPath << "' is: " << svninfo.NewRevision
                 << "\n");

    // svninfo.Root = ""; // uncomment to test GuessBase
    this->Log << "Repository '" << svninfo.LocalPath
              << "' URL = " << svninfo.URL << "\n";
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Root = " << svninfo.Root << "\n";

    // Compute the base path the working tree has checked out under
    // the repository root.
    if (!svninfo.Root.empty() &&
        cmCTestSVNPathStarts(svninfo.URL, svninfo.Root)) {
      svninfo.Base = cmStrCat(
        cmCTest::DecodeURL(svninfo.URL.substr(svninfo.Root.size())), '/');
    }
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Base = " << svninfo.Base << "\n";
  }

  // Set the global new revision to the one of the root
  this->NewRevision = this->RootInfo->NewRevision;
  return true;
}